

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresultstore.cpp
# Opt level: O0

bool __thiscall QtPrivate::ResultStoreBase::containsValidResultItem(ResultStoreBase *this,int index)

{
  bool bVar1;
  int in_ESI;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  QMap<int,_QtPrivate::ResultItem> *store;
  bool inPending;
  ResultIteratorBase it;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  bool bVar2;
  _Base_ptr this_00;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = false;
  if ((((ulong)(in_RDI._M_node)->_M_right & 1) != 0) && (uVar3 = false, in_ESI != -1)) {
    uVar3 = *(int *)&(in_RDI._M_node)->_M_left < in_ESI;
  }
  if ((bool)uVar3 == false) {
    this_00 = (_Base_ptr)&(in_RDI._M_node)->_M_parent;
  }
  else {
    this_00 = in_RDI._M_node + 1;
  }
  findResult((QMap<int,_QtPrivate::ResultItem> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (int)((ulong)lVar4 >> 0x20));
  QMap<int,_QtPrivate::ResultItem>::end
            ((QMap<int,_QtPrivate::ResultItem> *)CONCAT17(uVar3,in_stack_ffffffffffffffa0));
  ResultIteratorBase::ResultIteratorBase
            ((ResultIteratorBase *)this_00,(const_iterator)in_RDI._M_node,
             CONCAT13(in_stack_ffffffffffffff8f,
                      CONCAT12(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c)));
  bVar1 = QtPrivate::operator!=
                    ((ResultIteratorBase *)this_00,
                     (ResultIteratorBase *)
                     CONCAT17(in_stack_ffffffffffffff8f,
                              CONCAT16(in_stack_ffffffffffffff8e,
                                       CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                                      )));
  bVar2 = false;
  if (bVar1) {
    bVar2 = ResultIteratorBase::isValid((ResultIteratorBase *)0x6e8dca);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool ResultStoreBase::containsValidResultItem(int index) const
{
    // index might refer to either visible or pending result
    const bool inPending = m_filterMode && index != -1 && index > insertIndex;
    const auto &store = inPending ? pendingResults : m_results;
    auto it = findResult(store, index);
    return it != ResultIteratorBase(store.end()) && it.isValid();
}